

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O0

bool __thiscall
VmaBlockBufferImageGranularity::Validate
          (VmaBlockBufferImageGranularity *this,ValidationContext *ctx,VkDeviceSize offset,
          VkDeviceSize size)

{
  bool bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  long in_RSI;
  VmaBlockBufferImageGranularity *in_RDI;
  uint32_t end;
  uint32_t start;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  
  bVar1 = IsEnabled(in_RDI);
  if (bVar1) {
    uVar2 = GetStartPage((VmaBlockBufferImageGranularity *)
                         CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                         (VkDeviceSize)in_RDI);
    *(short *)(*(long *)(in_RSI + 8) + (ulong)uVar2 * 2) =
         *(short *)(*(long *)(in_RSI + 8) + (ulong)uVar2 * 2) + 1;
    if (in_RDI->m_RegionInfo[uVar2].allocCount == 0) {
      return false;
    }
    uVar3 = GetEndPage((VmaBlockBufferImageGranularity *)CONCAT44(uVar2,in_stack_ffffffffffffffd0),
                       (VkDeviceSize)in_RDI,0x2ec49c);
    if ((uVar2 != uVar3) &&
       (*(short *)(*(long *)(in_RSI + 8) + (ulong)uVar3 * 2) =
             *(short *)(*(long *)(in_RSI + 8) + (ulong)uVar3 * 2) + 1,
       in_RDI->m_RegionInfo[uVar3].allocCount == 0)) {
      return false;
    }
  }
  return true;
}

Assistant:

bool VmaBlockBufferImageGranularity::Validate(ValidationContext& ctx,
    VkDeviceSize offset, VkDeviceSize size) const
{
    if (IsEnabled())
    {
        uint32_t start = GetStartPage(offset);
        ++ctx.pageAllocs[start];
        VMA_VALIDATE(m_RegionInfo[start].allocCount > 0);

        uint32_t end = GetEndPage(offset, size);
        if (start != end)
        {
            ++ctx.pageAllocs[end];
            VMA_VALIDATE(m_RegionInfo[end].allocCount > 0);
        }
    }
    return true;
}